

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O3

void lua_xmove(lua_State *from,lua_State *to,int n)

{
  StkId pTVar1;
  StkId pTVar2;
  long lVar3;
  
  if ((from != to) && (from->top = from->top + -(long)n, 0 < n)) {
    lVar3 = 0;
    do {
      pTVar1 = from->top;
      pTVar2 = to->top;
      to->top = pTVar2 + 1;
      pTVar2->value = *(Value *)((long)&pTVar1->value + lVar3);
      pTVar2->tt = *(int *)((long)&pTVar1->tt + lVar3);
      lVar3 = lVar3 + 0x10;
    } while ((ulong)(uint)n << 4 != lVar3);
  }
  return;
}

Assistant:

LUA_API void lua_xmove (lua_State *from, lua_State *to, int n) {
  int i;
  if (from == to) return;
  lua_lock(to);
  api_checknelems(from, n);
  api_check(from, G(from) == G(to));
  api_check(from, to->ci->top - to->top >= n);
  from->top -= n;
  for (i = 0; i < n; i++) {
    setobj2s(to, to->top++, from->top + i);
  }
  lua_unlock(to);
}